

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

bool __thiscall BackwardPass::IsFormalParamSym(BackwardPass *this,Func *func,Sym *sym)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  ArgSlot AVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *this_00;
  
  if (sym == (Sym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x10b0,"(sym)","sym");
    if (!bVar3) goto LAB_003eac24;
    *puVar6 = 0;
  }
  if (sym->m_kind != SymKindStack) {
    if (sym->m_kind == SymKindProperty) {
      uVar1 = *(uint *)&sym[1]._vptr_Sym;
      BVar5 = Func::IsFormalsArraySym(func,(sym[1].m_next)->m_id);
      if (-1 < (int)uVar1 && BVar5 != 0) {
        this_00 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
        AVar4 = JITTimeFunctionBody::GetInParamsCount(this_00);
        return (long)(ulong)uVar1 < (long)((ulong)AVar4 - 1);
      }
      return false;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x10bd,"(sym->IsStackSym())","sym->IsStackSym()");
    if (!bVar3) goto LAB_003eac24;
    *puVar6 = 0;
  }
  if (sym->m_kind != SymKindStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar3) {
LAB_003eac24:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  BVar5 = Func::IsFormalsArraySym(func,sym->m_id);
  return BVar5 != 0;
}

Assistant:

bool
BackwardPass::IsFormalParamSym(Func * func, Sym * sym) const
{
    Assert(sym);

    if (sym->IsPropertySym())
    {
        //If the sym is a propertySym, then see if the propertyId is within the range of the formals
        //We can have other properties stored in the scope object other than the formals (following the formals).
        PropertySym * propSym = sym->AsPropertySym();
        IntConstType    value = propSym->m_propertyId;
        return func->IsFormalsArraySym(propSym->m_stackSym->m_id) &&
            (value >= 0 && value < func->GetJITFunctionBody()->GetInParamsCount() - 1);
    }
    else
    {
        Assert(sym->IsStackSym());
        return !!func->IsFormalsArraySym(sym->AsStackSym()->m_id);
    }
}